

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_block.h
# Opt level: O0

size_t google::protobuf::internal::StringBlock::Delete(StringBlock *block)

{
  LogMessage *pLVar1;
  StringBlock *size_00;
  size_t size;
  LogMessage local_30;
  Voidify local_19;
  StringBlock *local_18;
  StringBlock *block_local;
  
  local_18 = block;
  if (block != (StringBlock *)0x0) {
    if ((block->heap_allocated_ & 1U) == 0) {
      block_local = (StringBlock *)0x0;
    }
    else {
      size_00 = (StringBlock *)allocated_size(block);
      SizedDelete(local_18,(size_t)size_00);
      block_local = size_00;
    }
    return (size_t)block_local;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/string_block.h"
             ,0x93,"block != nullptr");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline size_t StringBlock::Delete(StringBlock* block) {
  ABSL_DCHECK(block != nullptr);
  if (!block->heap_allocated_) return size_t{0};
  size_t size = block->allocated_size();
  internal::SizedDelete(block, size);
  return size;
}